

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

FILE * pugi::impl::anon_unknown_0::open_file_wide(wchar_t *path,wchar_t *mode)

{
  wchar_t wVar1;
  long lVar2;
  wchar_t *pwVar3;
  char *buffer;
  FILE *pFVar4;
  size_t in_RCX;
  long lVar5;
  char mode_ascii [4];
  char local_2c [4];
  
  lVar2 = -4;
  do {
    lVar5 = lVar2 + 4;
    lVar2 = lVar2 + 4;
  } while (*(int *)((long)path + lVar5) != 0);
  if (lVar2 == 0) {
    lVar5 = 0;
  }
  else {
    pwVar3 = (wchar_t *)0x0;
    lVar5 = 0;
    do {
      wVar1 = path[(long)pwVar3];
      in_RCX = 4;
      if (((uint)wVar1 < 0x10000) && (in_RCX = 1, 0x7f < (uint)wVar1)) {
        in_RCX = 3 - (ulong)((uint)wVar1 < 0x800);
      }
      lVar5 = lVar5 + in_RCX;
      pwVar3 = (wchar_t *)((long)pwVar3 + 1);
    } while ((wchar_t *)(lVar2 >> 2) != pwVar3);
  }
  buffer = (char *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                             allocate)(lVar5 + 1);
  if (buffer == (char *)0x0) {
    buffer = (char *)0x0;
  }
  else {
    as_utf8_end(buffer,(size_t)path,(wchar_t *)(lVar2 >> 2),in_RCX);
    buffer[lVar5] = '\0';
  }
  if (buffer == (char *)0x0) {
    pFVar4 = (FILE *)0x0;
  }
  else {
    local_2c[0] = '\0';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    wVar1 = *mode;
    if (wVar1 != L'\0') {
      lVar2 = 0;
      do {
        local_2c[lVar2] = (char)wVar1;
        wVar1 = mode[lVar2 + 1];
        lVar2 = lVar2 + 1;
      } while (wVar1 != L'\0');
    }
    pFVar4 = fopen(buffer,local_2c);
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (buffer);
  }
  return (FILE *)pFVar4;
}

Assistant:

PUGI__FN FILE* open_file_wide(const wchar_t* path, const wchar_t* mode)
	{
		// there is no standard function to open wide paths, so our best bet is to try utf8 path
		char* path_utf8 = convert_path_heap(path);
		if (!path_utf8) return 0;

		// convert mode to ASCII (we mirror _wfopen interface)
		char mode_ascii[4] = {0};
		for (size_t i = 0; mode[i]; ++i) mode_ascii[i] = static_cast<char>(mode[i]);

		// try to open the utf8 path
		FILE* result = fopen(path_utf8, mode_ascii);

		// free dummy buffer
		xml_memory::deallocate(path_utf8);

		return result;
	}